

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O2

int __thiscall
Centaurus::LookaheadDFA<char>::run
          (LookaheadDFA<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq,int index,
          int input_pos)

{
  pointer pLVar1;
  pointer pNVar2;
  bool bVar3;
  pointer pNVar4;
  
  while( true ) {
    if (seq->_M_string_length == (long)input_pos) {
      return -1;
    }
    pLVar1 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar4 = *(pointer *)
              &pLVar1[index].
               super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
               .m_transitions.
               super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
               ._M_impl;
    pNVar2 = *(pointer *)
              ((long)&pLVar1[index].
                      super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                      .m_transitions.
                      super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              + 8);
    while( true ) {
      if (pNVar4 == pNVar2) {
        return -1;
      }
      bVar3 = CharClass<char>::includes(&pNVar4->m_label,(seq->_M_dataplus)._M_p[input_pos]);
      if (bVar3) break;
      pNVar4 = pNVar4 + 1;
    }
    index = pNVar4->m_dest;
    if (index < 0) break;
    input_pos = input_pos + 1;
  }
  return -index;
}

Assistant:

int run(const std::basic_string<TCHAR>& seq, int index = 0, int input_pos = 0) const
	{
		if (input_pos == seq.size())
		{
			return -1;
		}
		else
		{
			const LDFAState<TCHAR>& state = m_states[index];

			for (const auto& tr : state.get_transitions())
			{
				if (tr.label().includes(seq[input_pos]))
				{
					if (tr.dest() < 0)
					{
						return -tr.dest();
					}
					return run(seq, tr.dest(), input_pos + 1);
				}
			}
			return -1;
		}
	}